

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_set.cpp
# Opt level: O3

uint __thiscall
GIM_BOX_TREE::_sort_and_calc_splitting_index
          (GIM_BOX_TREE *this,gim_array<GIM_AABB_DATA> *primitive_boxes,uint startIndex,
          uint endIndex,uint splitAxis)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  undefined4 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  uint i;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float *pfVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 in_XMM3 [16];
  
  uVar18 = endIndex - startIndex;
  uVar21 = startIndex;
  if (startIndex <= endIndex && uVar18 != 0) {
    uVar17 = (ulong)startIndex;
    auVar24 = ZEXT816(0) << 0x40;
    pfVar20 = (float *)(*(long *)primitive_boxes + 0x10 + (ulong)splitAxis * 4 + uVar17 * 0x24);
    lVar22 = endIndex - uVar17;
    do {
      fVar4 = *pfVar20;
      pfVar1 = pfVar20 + -4;
      pfVar20 = pfVar20 + 9;
      lVar22 = lVar22 + -1;
      auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)(fVar4 + *pfVar1)),
                                SUB6416(ZEXT464(0x3f000000),0));
    } while (lVar22 != 0);
    if (startIndex < endIndex) {
      auVar7 = vcvtusi2ss_avx512f(in_XMM3,uVar18);
      lVar22 = (ulong)splitAxis * 4;
      lVar16 = endIndex - uVar17;
      lVar23 = uVar17 * 0x24;
      do {
        lVar6 = *(long *)primitive_boxes;
        puVar2 = (undefined8 *)(lVar6 + lVar23);
        if (auVar24._0_4_ / auVar7._0_4_ <
            (*(float *)(lVar22 + 0x10 + (long)puVar2) + *(float *)(lVar22 + (long)puVar2)) * 0.5) {
          uVar8 = *puVar2;
          uVar9 = puVar2[1];
          puVar3 = (undefined8 *)(lVar6 + 0x10 + lVar23);
          uVar17 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
          uVar10 = *puVar3;
          uVar11 = puVar3[1];
          uVar5 = *(undefined4 *)(puVar3 + 2);
          *(undefined4 *)(puVar2 + 4) = *(undefined4 *)(lVar6 + 0x20 + uVar17 * 0x24);
          puVar3 = (undefined8 *)(lVar6 + uVar17 * 0x24);
          uVar12 = puVar3[1];
          uVar13 = puVar3[2];
          uVar14 = puVar3[3];
          *puVar2 = *puVar3;
          puVar2[1] = uVar12;
          puVar2[2] = uVar13;
          puVar2[3] = uVar14;
          puVar2 = (undefined8 *)(lVar6 + uVar17 * 0x24);
          *puVar2 = uVar8;
          puVar2[1] = uVar9;
          puVar2[2] = uVar10;
          puVar2[3] = uVar11;
          *(undefined4 *)(lVar6 + 0x20 + uVar17 * 0x24) = uVar5;
        }
        lVar23 = lVar23 + 0x24;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
  }
  uVar19 = (uVar18 >> 1) + startIndex;
  uVar15 = uVar21;
  if (~(uVar18 / 3) + endIndex <= uVar21) {
    uVar15 = uVar19;
  }
  if (uVar21 <= uVar18 / 3 + startIndex) {
    uVar15 = uVar19;
  }
  return uVar15;
}

Assistant:

GUINT GIM_BOX_TREE::_sort_and_calc_splitting_index(
	gim_array<GIM_AABB_DATA>& primitive_boxes, GUINT startIndex,
	GUINT endIndex, GUINT splitAxis)
{
	GUINT i;
	GUINT splitIndex = startIndex;
	GUINT numIndices = endIndex - startIndex;

	// average of centers
	cbtScalar splitValue = 0.0f;
	for (i = startIndex; i < endIndex; i++)
	{
		splitValue += 0.5f * (primitive_boxes[i].m_bound.m_max[splitAxis] +
							  primitive_boxes[i].m_bound.m_min[splitAxis]);
	}
	splitValue /= (cbtScalar)numIndices;

	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i = startIndex; i < endIndex; i++)
	{
		cbtScalar center = 0.5f * (primitive_boxes[i].m_bound.m_max[splitAxis] +
								  primitive_boxes[i].m_bound.m_min[splitAxis]);
		if (center > splitValue)
		{
			//swap
			primitive_boxes.swap(i, splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	GUINT rangeBalancedIndices = numIndices / 3;
	bool unbalanced = ((splitIndex <= (startIndex + rangeBalancedIndices)) || (splitIndex >= (endIndex - 1 - rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex + (numIndices >> 1);
	}

	cbtAssert(!((splitIndex == startIndex) || (splitIndex == (endIndex))));

	return splitIndex;
}